

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O0

void __thiscall
celero::Printer::TableRowHeader(Printer *this,shared_ptr<celero::ExperimentResult> *x)

{
  element_type *this_00;
  Experiment *x_00;
  shared_ptr<celero::ExperimentResult> local_28;
  shared_ptr<celero::ExperimentResult> *local_18;
  shared_ptr<celero::ExperimentResult> *x_local;
  Printer *this_local;
  
  local_18 = x;
  x_local = (shared_ptr<celero::ExperimentResult> *)this;
  this_00 = std::
            __shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)x);
  x_00 = ExperimentResult::getExperiment(this_00);
  TableRowExperimentHeader(this,x_00);
  std::shared_ptr<celero::ExperimentResult>::shared_ptr(&local_28,x);
  TableRowProblemSpaceHeader(this,&local_28);
  std::shared_ptr<celero::ExperimentResult>::~shared_ptr(&local_28);
  return;
}

Assistant:

void Printer::TableRowHeader(std::shared_ptr<celero::ExperimentResult> x)
	{
		TableRowExperimentHeader(x->getExperiment());
		TableRowProblemSpaceHeader(x);
	}